

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall
CTxMemPool::UpdateEntryForAncestors(CTxMemPool *this,txiter it,setEntries *setAncestors)

{
  size_type *psVar1;
  long lVar2;
  size_t modifyCount;
  CTxMemPoolEntry *this_00;
  bool bVar3;
  int32_t iVar4;
  _Base_ptr p_Var5;
  int modifySize;
  long modifyFee;
  long modifySigOps;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  modifyCount = (setAncestors->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  modifySigOps = 0;
  modifyFee = 0;
  modifySize = 0;
  for (p_Var5 = (setAncestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(setAncestors->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    this_00 = *(CTxMemPoolEntry **)(p_Var5 + 1);
    iVar4 = CTxMemPoolEntry::GetTxSize(this_00);
    modifySize = modifySize + iVar4;
    modifyFee = modifyFee + this_00->m_modified_fee;
    modifySigOps = modifySigOps + this_00->sigOpCost;
  }
  CTxMemPoolEntry::UpdateAncestorState
            ((CTxMemPoolEntry *)it.node,modifySize,modifyFee,modifyCount,modifySigOps);
  bVar3 = boost::multi_index::detail::
          hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
          ::modify_(&(this->mapTx).super_type,it.node);
  if (!bVar3) {
    boost::multi_index::
    multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>
    ::delete_node_(&this->mapTx,it.node);
    psVar1 = &(this->mapTx).node_count;
    *psVar1 = *psVar1 - 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTxMemPool::UpdateEntryForAncestors(txiter it, const setEntries &setAncestors)
{
    int64_t updateCount = setAncestors.size();
    int64_t updateSize = 0;
    CAmount updateFee = 0;
    int64_t updateSigOpsCost = 0;
    for (txiter ancestorIt : setAncestors) {
        updateSize += ancestorIt->GetTxSize();
        updateFee += ancestorIt->GetModifiedFee();
        updateSigOpsCost += ancestorIt->GetSigOpCost();
    }
    mapTx.modify(it, [=](CTxMemPoolEntry& e){ e.UpdateAncestorState(updateSize, updateFee, updateCount, updateSigOpsCost); });
}